

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Matrix.c
# Opt level: O1

void Llb_MtrPrintMatrixStats(Llb_Mtr_t *p)

{
  uint uVar1;
  int *piVar2;
  void *__ptr;
  void *__ptr_00;
  uint uVar3;
  size_t sVar4;
  int iVar5;
  ulong uVar6;
  size_t __nmemb;
  uint uVar7;
  char *format;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  double dVar13;
  
  uVar1 = p->nRows;
  __nmemb = (size_t)(int)uVar1;
  __ptr = calloc(__nmemb,4);
  __ptr_00 = calloc(__nmemb,4);
  if ((long)__nmemb < 1) {
    dVar13 = 0.0;
  }
  else {
    piVar2 = p->pRowSums;
    sVar4 = 0;
    iVar5 = 0;
    do {
      if (piVar2[sVar4] != 0) {
        uVar10 = p->nCols;
        uVar6 = (ulong)uVar10;
        if ((int)uVar10 < 1) {
          uVar9 = 0;
        }
        else {
          uVar9 = 0;
          do {
            if (p->pMatrix[uVar9][sVar4] == '\x01') goto LAB_007cb8b2;
            uVar9 = uVar9 + 1;
          } while (uVar6 != uVar9);
          uVar9 = (ulong)uVar10;
        }
LAB_007cb8b2:
        uVar10 = (int)uVar10 >> 0x1f & uVar10;
        uVar12 = uVar6;
        do {
          uVar12 = uVar12 - 1;
          uVar3 = (uint)uVar6;
          uVar11 = uVar10;
          uVar7 = uVar10 - 1;
          if ((int)uVar3 < 1) break;
          uVar7 = uVar3 - 1;
          uVar6 = (ulong)uVar7;
          uVar11 = uVar3;
        } while (p->pMatrix[uVar12 & 0xffffffff][sVar4] != '\x01');
        iVar8 = (int)uVar9;
        if ((int)uVar11 <= iVar8) {
          __assert_fail("iGrp1 <= iGrp2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Matrix.c"
                        ,0xfb,"void Llb_MtrPrintMatrixStats(Llb_Mtr_t *)");
        }
        *(int *)((long)__ptr + sVar4 * 4) = iVar8;
        *(uint *)((long)__ptr_00 + sVar4 * 4) = uVar7;
        iVar5 = (iVar5 - iVar8) + uVar7;
      }
      sVar4 = sVar4 + 1;
    } while (sVar4 != __nmemb);
    dVar13 = (double)iVar5;
  }
  uVar10 = p->nCols;
  if ((int)uVar10 < 1) {
    uVar7 = 0;
    uVar11 = 0;
  }
  else {
    uVar11 = 0;
    uVar7 = 0;
    uVar3 = 0;
    do {
      if (0 < (int)uVar1) {
        uVar6 = 0;
        do {
          uVar7 = uVar7 + (*(uint *)((long)__ptr + uVar6 * 4) == uVar3);
          uVar6 = uVar6 + 1;
        } while (uVar1 != uVar6);
      }
      if ((int)uVar11 <= (int)uVar7) {
        uVar11 = uVar7;
      }
      if (0 < (int)uVar1) {
        uVar6 = 0;
        do {
          uVar7 = uVar7 - (*(uint *)((long)__ptr_00 + uVar6 * 4) == uVar3);
          uVar6 = uVar6 + 1;
        } while (uVar1 != uVar6);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar10);
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  if (__ptr_00 != (void *)0x0) {
    free(__ptr_00);
  }
  iVar5 = 0x9466bc;
  format = (char *)(ulong)uVar10;
  printf("[%4d x %4d]  Life-span =%6.2f  Max-cut =%5d\n",dVar13 / (double)(int)uVar1,format,
         (ulong)uVar1,(ulong)uVar11);
  if (uVar7 == 0) {
    return;
  }
  Abc_Print(iVar5,format,(ulong)uVar7);
  return;
}

Assistant:

void Llb_MtrPrintMatrixStats( Llb_Mtr_t * p )
{
    int iVar, iGrp, iGrp1, iGrp2, Span = 0, nCutSize = 0, nCutSizeMax = 0;
    int * pGrp1 = ABC_CALLOC( int, p->nRows ); 
    int * pGrp2 = ABC_CALLOC( int, p->nRows ); 
    for ( iVar = 0; iVar < p->nRows; iVar++ )
    {
        if ( p->pRowSums[iVar] == 0 )
            continue;
        for ( iGrp1 = 0; iGrp1 < p->nCols; iGrp1++ )
            if ( p->pMatrix[iGrp1][iVar] == 1 )
                break;
        for ( iGrp2 = p->nCols - 1; iGrp2 >= 0; iGrp2-- )
            if ( p->pMatrix[iGrp2][iVar] == 1 )
                break;
        assert( iGrp1 <= iGrp2 );
        pGrp1[iVar] = iGrp1;
        pGrp2[iVar] = iGrp2;
        Span += iGrp2 - iGrp1;
    }
    // compute span
    for ( iGrp = 0; iGrp < p->nCols; iGrp++ )
    {
        for ( iVar = 0; iVar < p->nRows; iVar++ )
            if ( pGrp1[iVar] == iGrp )
                nCutSize++;
        if ( nCutSizeMax < nCutSize )
            nCutSizeMax = nCutSize;
        for ( iVar = 0; iVar < p->nRows; iVar++ )
            if ( pGrp2[iVar] == iGrp )
                nCutSize--;
    }
    ABC_FREE( pGrp1 );
    ABC_FREE( pGrp2 );
    printf( "[%4d x %4d]  Life-span =%6.2f  Max-cut =%5d\n", 
        p->nCols, p->nRows, 1.0*Span/p->nRows, nCutSizeMax );
    if ( nCutSize )
        Abc_Print( -1, "Cut size is not zero (%d).\n", nCutSize );
}